

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O3

void __thiscall
spirv_cross::ParsedIR::make_constant_null
          (ParsedIR *this,uint32_t id,uint32_t type,bool add_to_typed_id_set)

{
  char *pcVar1;
  uint *puVar2;
  size_t sVar3;
  Variant *pVVar4;
  bool add_to_typed_id_set_00;
  ID IVar5;
  uint32_t uVar6;
  SPIRType *pSVar7;
  SPIRConstant *pSVar8;
  long lVar9;
  runtime_error *this_00;
  undefined7 in_register_00000009;
  uint uVar10;
  ulong uVar11;
  SmallVector<unsigned_int,_8UL> elements;
  undefined1 *apuStack_158 [2];
  bool local_141;
  uint32_t local_140;
  undefined4 local_13c;
  ID local_138;
  uint local_134;
  AlignedBuffer<unsigned_int,_8UL> *local_130;
  SmallVector<unsigned_int,_8UL> local_128 [4];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  apuStack_158[1] = (undefined1 *)0x2cf435;
  local_140 = type;
  pSVar7 = Variant::get<spirv_cross::SPIRType>
                     ((this->ids).super_VectorView<spirv_cross::Variant>.ptr + type);
  if (pSVar7->pointer == true) {
    if (add_to_typed_id_set) {
      apuStack_158[1] = (undefined1 *)0x2cf455;
      add_typed_id(this,TypeConstant,(ID)id);
    }
    pVVar4 = (this->ids).super_VectorView<spirv_cross::Variant>.ptr + id;
    apuStack_158[1] = (undefined1 *)0x2cf475;
    pSVar8 = ObjectPool<spirv_cross::SPIRConstant>::allocate<unsigned_int&>
                       ((ObjectPool<spirv_cross::SPIRConstant> *)
                        pVVar4->group->pools[3]._M_t.
                        super___uniq_ptr_impl<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spirv_cross::ObjectPoolBase_*,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                        .super__Head_base<0UL,_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl,
                        &local_140);
    apuStack_158[1] = (undefined1 *)0x2cf488;
    Variant::set(pVVar4,&pSVar8->super_IVariant,TypeConstant);
    (pSVar8->super_IVariant).self.id = id;
    apuStack_158[1] = (undefined1 *)0x2cf49d;
    memset(local_128,0,0xf8);
    lVar9 = 0x30;
    do {
      *(undefined8 *)((long)&local_138.id + lVar9) = 0;
      *(undefined8 *)((long)&local_130 + lVar9) = 0;
      pcVar1 = local_128[0].stack_storage.aligned_char + lVar9 + -0x18;
      pcVar1[0] = '\x01';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      *(undefined8 *)((long)apuStack_158 + lVar9) = 0;
      *(undefined8 *)((long)apuStack_158 + lVar9 + 8) = 0;
      *(undefined8 *)(&stack0xfffffffffffffeb8 + lVar9) = 0;
      *(undefined8 *)((long)&local_140 + lVar9) = 0;
      lVar9 = lVar9 + 0x38;
    } while (lVar9 != 0x110);
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 1;
    apuStack_158[1] = (undefined1 *)0x2cf4f1;
    memcpy(&pSVar8->m,local_128,0xf4);
    (pSVar8->m).columns = pSVar7->columns;
    uVar6 = pSVar7->vecsize;
    lVar9 = -0xe0;
    do {
      *(uint32_t *)((pSVar8->subconstants).stack_storage.aligned_char + lVar9 + -8) = uVar6;
      lVar9 = lVar9 + 0x38;
    } while (lVar9 != 0);
    return;
  }
  if ((pSVar7->array).super_VectorView<unsigned_int>.buffer_size == 0) {
    sVar3 = (pSVar7->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size;
    if (sVar3 == 0) {
      if (add_to_typed_id_set) {
        apuStack_158[1] = (undefined1 *)0x2cf780;
        add_typed_id(this,TypeConstant,(ID)id);
      }
      pVVar4 = (this->ids).super_VectorView<spirv_cross::Variant>.ptr + id;
      apuStack_158[1] = (undefined1 *)0x2cf7a0;
      pSVar8 = ObjectPool<spirv_cross::SPIRConstant>::allocate<unsigned_int&>
                         ((ObjectPool<spirv_cross::SPIRConstant> *)
                          pVVar4->group->pools[3]._M_t.
                          super___uniq_ptr_impl<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spirv_cross::ObjectPoolBase_*,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                          .super__Head_base<0UL,_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl,
                          &local_140);
      apuStack_158[1] = (undefined1 *)0x2cf7b3;
      Variant::set(pVVar4,&pSVar8->super_IVariant,TypeConstant);
      (pSVar8->super_IVariant).self.id = id;
      apuStack_158[1] = (undefined1 *)0x2cf7c8;
      memset(local_128,0,0xf8);
      lVar9 = 0x30;
      do {
        *(undefined8 *)((long)&local_138.id + lVar9) = 0;
        *(undefined8 *)((long)&local_130 + lVar9) = 0;
        pcVar1 = local_128[0].stack_storage.aligned_char + lVar9 + -0x18;
        pcVar1[0] = '\x01';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        *(undefined8 *)((long)apuStack_158 + lVar9) = 0;
        *(undefined8 *)((long)apuStack_158 + lVar9 + 8) = 0;
        *(undefined8 *)(&stack0xfffffffffffffeb8 + lVar9) = 0;
        *(undefined8 *)((long)&local_140 + lVar9) = 0;
        lVar9 = lVar9 + 0x38;
      } while (lVar9 != 0x110);
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 1;
      apuStack_158[1] = (undefined1 *)0x2cf81c;
      memcpy(&pSVar8->m,local_128,0xf4);
      (pSVar8->m).columns = pSVar7->columns;
      uVar6 = pSVar7->vecsize;
      lVar9 = -0xe0;
      do {
        *(uint32_t *)((pSVar8->subconstants).stack_storage.aligned_char + lVar9 + -8) = uVar6;
        lVar9 = lVar9 + 0x38;
      } while (lVar9 != 0);
      return;
    }
    local_13c = (undefined4)CONCAT71(in_register_00000009,add_to_typed_id_set);
    apuStack_158[1] = (undefined1 *)0x2cf663;
    local_138.id = id;
    uVar6 = increase_bound_by(this,(uint32_t)sVar3);
    local_128[0].super_VectorView<unsigned_int>.ptr = (uint *)&local_128[0].stack_storage;
    local_128[0].super_VectorView<unsigned_int>.buffer_size = 0;
    local_128[0].buffer_capacity = 8;
    apuStack_158[1] = (undefined1 *)0x2cf690;
    SmallVector<unsigned_int,_8UL>::resize
              (local_128,
               (pSVar7->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
               .buffer_size);
    if ((pSVar7->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
        buffer_size != 0) {
      uVar10 = 1;
      uVar11 = 0;
      add_to_typed_id_set_00 = (bool)(char)local_13c;
      do {
        apuStack_158[1] = (undefined1 *)0x2cf6bf;
        make_constant_null(this,uVar6,
                           (pSVar7->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                           [uVar11].id,add_to_typed_id_set_00);
        *(uint32_t *)((char *)local_128[0].super_VectorView<unsigned_int>.ptr + uVar11 * 4) = uVar6;
        uVar11 = (ulong)uVar10;
        uVar6 = uVar6 + 1;
        uVar10 = uVar10 + 1;
      } while (uVar11 < (pSVar7->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size);
    }
    IVar5.id = local_138.id;
    if ((char)local_13c != '\0') {
      apuStack_158[1] = (undefined1 *)0x2cf6f2;
      add_typed_id(this,TypeConstant,local_138);
    }
    pVVar4 = (this->ids).super_VectorView<spirv_cross::Variant>.ptr;
    local_130 = (AlignedBuffer<unsigned_int,_8UL> *)local_128[0].super_VectorView<unsigned_int>.ptr;
    local_134 = (uint)local_128[0].super_VectorView<unsigned_int>.buffer_size;
    local_141 = false;
    apuStack_158[1] = (undefined1 *)0x2cf72f;
    pSVar8 = ObjectPool<spirv_cross::SPIRConstant>::
             allocate<unsigned_int&,unsigned_int*,unsigned_int,bool>
                       ((ObjectPool<spirv_cross::SPIRConstant> *)
                        (pVVar4[IVar5.id].group)->pools[3]._M_t.
                        super___uniq_ptr_impl<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spirv_cross::ObjectPoolBase_*,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                        ,&local_140,(uint **)&local_130,&local_134,&local_141);
    apuStack_158[1] = (undefined1 *)0x2cf743;
    Variant::set(pVVar4 + IVar5.id,&pSVar8->super_IVariant,TypeConstant);
    (pSVar8->super_IVariant).self.id = IVar5.id;
    if ((AlignedBuffer<unsigned_int,_8UL> *)local_128[0].super_VectorView<unsigned_int>.ptr ==
        &local_128[0].stack_storage) {
      return;
    }
  }
  else {
    if ((pSVar7->parent_type).id == 0) {
      apuStack_158[1] = (undefined1 *)0x2cf871;
      __assert_fail("constant_type.parent_type",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_cross_parsed_ir.cpp"
                    ,0x3ed,
                    "void spirv_cross::ParsedIR::make_constant_null(uint32_t, uint32_t, bool)");
    }
    apuStack_158[1] = (undefined1 *)0x2cf540;
    uVar6 = increase_bound_by(this,1);
    apuStack_158[1] = (undefined1 *)0x2cf557;
    make_constant_null(this,uVar6,(pSVar7->parent_type).id,add_to_typed_id_set);
    if ((pSVar7->array_size_literal).super_VectorView<bool>.ptr
        [(pSVar7->array_size_literal).super_VectorView<bool>.buffer_size - 1] == false) {
      apuStack_158[1] = (undefined1 *)0x2cf87b;
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_128[0].super_VectorView<unsigned_int>.ptr = (uint *)&local_128[0].buffer_capacity;
      apuStack_158[1] = (undefined1 *)0x2cf89f;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_128,"Array size of OpConstantNull must be a literal.","");
      apuStack_158[1] = (undefined1 *)0x2cf8af;
      ::std::runtime_error::runtime_error(this_00,(string *)local_128);
      *(undefined ***)this_00 = &PTR__runtime_error_00357118;
      apuStack_158[1] = &LAB_002cf8d1;
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_128[0].super_VectorView<unsigned_int>.buffer_size = 0;
    local_128[0].buffer_capacity = 8;
    apuStack_158[1] = (undefined1 *)0x2cf599;
    local_128[0].super_VectorView<unsigned_int>.ptr = (uint *)&local_128[0].stack_storage;
    SmallVector<unsigned_int,_8UL>::resize
              (local_128,
               (ulong)(pSVar7->array).super_VectorView<unsigned_int>.ptr
                      [(pSVar7->array).super_VectorView<unsigned_int>.buffer_size - 1]);
    puVar2 = (pSVar7->array).super_VectorView<unsigned_int>.ptr;
    sVar3 = (pSVar7->array).super_VectorView<unsigned_int>.buffer_size;
    if (puVar2[sVar3 - 1] != 0) {
      uVar11 = 0;
      do {
        *(uint32_t *)((char *)local_128[0].super_VectorView<unsigned_int>.ptr + uVar11 * 4) = uVar6;
        uVar11 = uVar11 + 1;
      } while (uVar11 < puVar2[sVar3 - 1]);
    }
    if (add_to_typed_id_set) {
      apuStack_158[1] = (undefined1 *)0x2cf5d2;
      add_typed_id(this,TypeConstant,(ID)id);
    }
    pVVar4 = (this->ids).super_VectorView<spirv_cross::Variant>.ptr;
    local_130 = (AlignedBuffer<unsigned_int,_8UL> *)local_128[0].super_VectorView<unsigned_int>.ptr;
    local_134 = (uint)local_128[0].super_VectorView<unsigned_int>.buffer_size;
    local_141 = false;
    apuStack_158[1] = (undefined1 *)0x2cf60f;
    pSVar8 = ObjectPool<spirv_cross::SPIRConstant>::
             allocate<unsigned_int&,unsigned_int*,unsigned_int,bool>
                       ((ObjectPool<spirv_cross::SPIRConstant> *)
                        (pVVar4[id].group)->pools[3]._M_t.
                        super___uniq_ptr_impl<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spirv_cross::ObjectPoolBase_*,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                        ,&local_140,(uint **)&local_130,&local_134,&local_141);
    apuStack_158[1] = (undefined1 *)0x2cf623;
    Variant::set(pVVar4 + id,&pSVar8->super_IVariant,TypeConstant);
    (pSVar8->super_IVariant).self.id = id;
    if ((AlignedBuffer<unsigned_int,_8UL> *)local_128[0].super_VectorView<unsigned_int>.ptr ==
        &local_128[0].stack_storage) {
      return;
    }
  }
  local_128[0].super_VectorView<unsigned_int>.buffer_size = 0;
  apuStack_158[1] = (undefined1 *)0x2cf768;
  free(local_128[0].super_VectorView<unsigned_int>.ptr);
  return;
}

Assistant:

void ParsedIR::make_constant_null(uint32_t id, uint32_t type, bool add_to_typed_id_set)
{
	auto &constant_type = get<SPIRType>(type);

	if (constant_type.pointer)
	{
		if (add_to_typed_id_set)
			add_typed_id(TypeConstant, id);
		auto &constant = variant_set<SPIRConstant>(ids[id], type);
		constant.self = id;
		constant.make_null(constant_type);
	}
	else if (!constant_type.array.empty())
	{
		assert(constant_type.parent_type);
		uint32_t parent_id = increase_bound_by(1);
		make_constant_null(parent_id, constant_type.parent_type, add_to_typed_id_set);

		if (!constant_type.array_size_literal.back())
			SPIRV_CROSS_THROW("Array size of OpConstantNull must be a literal.");

		SmallVector<uint32_t> elements(constant_type.array.back());
		for (uint32_t i = 0; i < constant_type.array.back(); i++)
			elements[i] = parent_id;

		if (add_to_typed_id_set)
			add_typed_id(TypeConstant, id);
		variant_set<SPIRConstant>(ids[id], type, elements.data(), uint32_t(elements.size()), false).self = id;
	}
	else if (!constant_type.member_types.empty())
	{
		uint32_t member_ids = increase_bound_by(uint32_t(constant_type.member_types.size()));
		SmallVector<uint32_t> elements(constant_type.member_types.size());
		for (uint32_t i = 0; i < constant_type.member_types.size(); i++)
		{
			make_constant_null(member_ids + i, constant_type.member_types[i], add_to_typed_id_set);
			elements[i] = member_ids + i;
		}

		if (add_to_typed_id_set)
			add_typed_id(TypeConstant, id);
		variant_set<SPIRConstant>(ids[id], type, elements.data(), uint32_t(elements.size()), false).self = id;
	}
	else
	{
		if (add_to_typed_id_set)
			add_typed_id(TypeConstant, id);
		auto &constant = variant_set<SPIRConstant>(ids[id], type);
		constant.self = id;
		constant.make_null(constant_type);
	}
}